

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btHashKey<btTriIndex>_>::~btAlignedObjectArray
          (btAlignedObjectArray<btHashKey<btTriIndex>_> *this)

{
  if ((this->m_data != (btHashKey<btTriIndex> *)0x0) && (this->m_ownsMemory == true)) {
    btAlignedFreeInternal(this->m_data);
  }
  this->m_ownsMemory = true;
  this->m_data = (btHashKey<btTriIndex> *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}